

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ImfMultiView.cpp
# Opt level: O3

int Imf_3_4::anon_unknown_5::viewNum(string *view,StringVector *multiView)

{
  int iVar1;
  long in_RCX;
  long in_RDX;
  long lVar2;
  long lVar3;
  long *plVar4;
  
  if (in_RCX - in_RDX != 0) {
    lVar3 = in_RCX - in_RDX >> 5;
    plVar4 = (long *)(in_RDX + 8);
    lVar2 = 0;
    do {
      if (((StringVector *)*plVar4 == multiView) &&
         ((multiView == (StringVector *)0x0 ||
          (iVar1 = bcmp((void *)plVar4[-1],view,(size_t)multiView), iVar1 == 0)))) {
        return (int)lVar2;
      }
      lVar2 = lVar2 + 1;
      plVar4 = plVar4 + 4;
    } while (lVar3 + (ulong)(lVar3 == 0) != lVar2);
  }
  return -1;
}

Assistant:

int
viewNum (const string& view, const StringVector& multiView)
{
    //
    // returns which view number is called 'view'
    // returns -1 if no member of multiView is 'view'
    // (i.e. if viewNum() returns -1, 'view' isn't a view name
    //       if viewNum() returns 0, 'view' is the default view
    // otherwise, it's some other (valid) view
    //

    for (size_t i = 0; i < multiView.size (); ++i)
    {
        if (multiView[i] == view) return i;
    }

    return -1;
}